

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.cpp
# Opt level: O2

void __thiscall CubicInterpolation::print(CubicInterpolation *this,ostream *out,string *s)

{
  long lVar1;
  
  std::operator<<(out,(string *)s);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x10) {
    Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
                          ((long)this->coeffs_[0].
                                 super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                                 m_storage.m_data.array + lVar1));
  }
  std::operator<<(out,'\n');
  return;
}

Assistant:

void CubicInterpolation::print(std::ostream& out, const std::string& s) const {
  out << s;
  for (const auto& c : coeffs_) {
    out << c;
  }
  out << '\n';
}